

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

void anon_unknown.dwarf_dce8de::AddInterfaceEntries
               (cmGeneratorTarget *headTarget,string *config,string *prop,string *lang,
               cmGeneratorExpressionDAGChecker *dagChecker,EvaluatedTargetPropertyEntries *entries,
               IncludeRuntimeInterface searchRuntime,LinkInterfaceFor interfaceFor)

{
  bool bVar1;
  pointer pvVar2;
  cmLinkImplementationLibraries *libraries;
  cmLinkImplementationLibraries *impl_1;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>_>,_true>
  local_48;
  const_iterator runtimeLibIt;
  cmLinkImplementation *impl;
  EvaluatedTargetPropertyEntries *entries_local;
  cmGeneratorExpressionDAGChecker *dagChecker_local;
  string *lang_local;
  string *prop_local;
  string *config_local;
  cmGeneratorTarget *headTarget_local;
  
  if (searchRuntime == Yes) {
    runtimeLibIt.
    super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>_>,_true>
    ._M_cur = (_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>_>,_true>
               )cmGeneratorTarget::GetLinkImplementation(headTarget,config,interfaceFor);
    if (runtimeLibIt.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>_>,_true>
        ._M_cur != (__node_type *)0x0) {
      entries->HadContextSensitiveCondition =
           (bool)(*(bool *)&(((__node_type *)
                             ((long)runtimeLibIt.
                                    super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>_>,_true>
                                    ._M_cur + 0x48))->super__Hash_node_base)._M_nxt & 1);
      local_48._M_cur =
           (__node_type *)
           std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>_>_>_>
           ::find((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>_>_>_>
                   *)((long)&(((__node_type *)
                              ((long)runtimeLibIt.
                                     super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>_>,_true>
                                     ._M_cur + 0x48))->
                             super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>_>,_true>
                             ).
                             super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>_>_>
                             ._M_storage._M_storage + 0x18),lang);
      impl_1 = (cmLinkImplementationLibraries *)
               std::
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>_>_>_>
               ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>_>_>_>
                      *)((long)runtimeLibIt.
                               super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>_>,_true>
                               ._M_cur + 0x68));
      bVar1 = std::__detail::operator!=
                        (&local_48,
                         (_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>_>,_true>
                          *)&impl_1);
      if (bVar1) {
        pvVar2 = std::__detail::
                 _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>_>,_false,_true>
                 ::operator->((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>_>,_false,_true>
                               *)&local_48);
        addInterfaceEntry(headTarget,config,prop,lang,dagChecker,entries,interfaceFor,
                          &pvVar2->second);
      }
      addInterfaceEntry(headTarget,config,prop,lang,dagChecker,entries,interfaceFor,
                        (vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_> *)
                        runtimeLibIt.
                        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>_>,_true>
                        ._M_cur);
    }
  }
  else {
    libraries = cmGeneratorTarget::GetLinkImplementationLibraries(headTarget,config,interfaceFor);
    if (libraries != (cmLinkImplementationLibraries *)0x0) {
      entries->HadContextSensitiveCondition = (bool)(libraries->HadContextSensitiveCondition & 1);
      addInterfaceEntry(headTarget,config,prop,lang,dagChecker,entries,interfaceFor,
                        &libraries->Libraries);
    }
  }
  return;
}

Assistant:

void AddInterfaceEntries(
  cmGeneratorTarget const* headTarget, std::string const& config,
  std::string const& prop, std::string const& lang,
  cmGeneratorExpressionDAGChecker* dagChecker,
  EvaluatedTargetPropertyEntries& entries,
  IncludeRuntimeInterface searchRuntime,
  LinkInterfaceFor interfaceFor = LinkInterfaceFor::Usage)
{
  if (searchRuntime == IncludeRuntimeInterface::Yes) {
    if (cmLinkImplementation const* impl =
          headTarget->GetLinkImplementation(config, interfaceFor)) {
      entries.HadContextSensitiveCondition =
        impl->HadContextSensitiveCondition;

      auto runtimeLibIt = impl->LanguageRuntimeLibraries.find(lang);
      if (runtimeLibIt != impl->LanguageRuntimeLibraries.end()) {
        addInterfaceEntry(headTarget, config, prop, lang, dagChecker, entries,
                          interfaceFor, runtimeLibIt->second);
      }
      addInterfaceEntry(headTarget, config, prop, lang, dagChecker, entries,
                        interfaceFor, impl->Libraries);
    }
  } else {
    if (cmLinkImplementationLibraries const* impl =
          headTarget->GetLinkImplementationLibraries(config, interfaceFor)) {
      entries.HadContextSensitiveCondition =
        impl->HadContextSensitiveCondition;
      addInterfaceEntry(headTarget, config, prop, lang, dagChecker, entries,
                        interfaceFor, impl->Libraries);
    }
  }
}